

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestFrameDropRealtime_ChangingDropFrameThresh_Test>
::CreateTest(ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestFrameDropRealtime_ChangingDropFrameThresh_Test>
             *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x4d0);
  datarate_test::anon_unknown_0::DatarateTestFrameDropRealtime_ChangingDropFrameThresh_Test::
  DatarateTestFrameDropRealtime_ChangingDropFrameThresh_Test
            ((DatarateTestFrameDropRealtime_ChangingDropFrameThresh_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }